

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  undefined1 auVar5 [32];
  undefined8 uVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  undefined8 uVar10;
  byte bVar11;
  undefined1 auVar12 [16];
  byte bVar13;
  uint uVar14;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar15) [32];
  long lVar16;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [32];
  undefined4 uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  float fVar73;
  float fVar74;
  undefined1 auVar72 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  uint local_2640;
  undefined1 local_2639;
  ulong local_2638;
  Geometry *local_2630;
  RTCIntersectArguments *local_2628;
  ulong local_2620;
  long local_2618;
  int local_260c;
  RayHit *local_2608;
  RayQueryContext *local_2600;
  Scene *local_25f8;
  ulong *local_25f0;
  long local_25e8;
  long local_25e0;
  RTCFilterFunctionNArguments local_25d8;
  float local_25a8;
  undefined4 local_25a4;
  undefined4 local_25a0;
  undefined4 local_259c;
  undefined4 local_2598;
  undefined4 local_2594;
  uint local_2590;
  uint local_258c;
  uint local_2588;
  undefined1 local_2578 [16];
  undefined1 local_2568 [16];
  undefined1 local_2558 [32];
  undefined1 local_2538 [32];
  undefined1 local_2518 [32];
  undefined1 local_24f8 [32];
  undefined1 local_24d8 [32];
  undefined1 local_24b8 [16];
  undefined1 local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 *local_2488;
  byte local_2480;
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 local_2458 [16];
  undefined1 local_2448 [16];
  undefined1 local_2438 [16];
  float local_2428 [4];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  float local_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  float fStack_23a0;
  float fStack_239c;
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    local_25f0 = local_2368;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar47 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar57 = (ray->super_RayK<1>).tfar;
    auVar63 = ZEXT464((uint)fVar57);
    auVar26._8_4_ = 0x7fffffff;
    auVar26._0_8_ = 0x7fffffff7fffffff;
    auVar26._12_4_ = 0x7fffffff;
    auVar26 = vandps_avx512vl((undefined1  [16])aVar2,auVar26);
    auVar27._8_4_ = 0x219392ef;
    auVar27._0_8_ = 0x219392ef219392ef;
    auVar27._12_4_ = 0x219392ef;
    uVar21 = vcmpps_avx512vl(auVar26,auVar27,1);
    auVar26 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar84 = ZEXT1664(auVar26);
    local_2370[0] = 0;
    auVar26 = vdivps_avx512vl(auVar26,(undefined1  [16])aVar2);
    auVar27 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar4 = (bool)((byte)uVar21 & 1);
    auVar35._0_4_ = (uint)bVar4 * auVar27._0_4_ | (uint)!bVar4 * auVar26._0_4_;
    bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
    auVar35._4_4_ = (uint)bVar4 * auVar27._4_4_ | (uint)!bVar4 * auVar26._4_4_;
    bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
    auVar35._8_4_ = (uint)bVar4 * auVar27._8_4_ | (uint)!bVar4 * auVar26._8_4_;
    bVar4 = (bool)((byte)(uVar21 >> 3) & 1);
    auVar35._12_4_ = (uint)bVar4 * auVar27._12_4_ | (uint)!bVar4 * auVar26._12_4_;
    auVar43._8_4_ = 0x3f7ffffa;
    auVar43._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar43._12_4_ = 0x3f7ffffa;
    auVar28 = vmulps_avx512vl(auVar35,auVar43);
    auVar29._8_4_ = 0x3f800003;
    auVar29._0_8_ = 0x3f8000033f800003;
    auVar29._12_4_ = 0x3f800003;
    auVar29 = vmulps_avx512vl(auVar35,auVar29);
    local_24d8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar85 = ZEXT3264(local_24d8);
    local_24f8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar86 = ZEXT3264(local_24f8);
    auVar26 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar57));
    local_2518 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar87 = ZEXT3264(local_2518);
    local_2538 = vbroadcastss_avx512vl(auVar28);
    auVar88 = ZEXT3264(local_2538);
    auVar27 = vmovshdup_avx(auVar28);
    local_2558 = vbroadcastsd_avx512vl(auVar27);
    auVar89 = ZEXT3264(local_2558);
    auVar43 = vshufpd_avx(auVar28,auVar28,1);
    auVar50._8_4_ = 2;
    auVar50._0_8_ = 0x200000002;
    auVar50._12_4_ = 2;
    auVar50._16_4_ = 2;
    auVar50._20_4_ = 2;
    auVar50._24_4_ = 2;
    auVar50._28_4_ = 2;
    local_2398 = vpermps_avx2(auVar50,ZEXT1632(auVar28));
    auVar71 = ZEXT3264(local_2398);
    fVar57 = auVar29._0_4_;
    auVar49._8_4_ = 1;
    auVar49._0_8_ = 0x100000001;
    auVar49._12_4_ = 1;
    auVar49._16_4_ = 1;
    auVar49._20_4_ = 1;
    auVar49._24_4_ = 1;
    auVar49._28_4_ = 1;
    local_23d8 = vpermps_avx2(auVar49,ZEXT1632(auVar29));
    auVar79 = ZEXT3264(local_23d8);
    local_23f8 = vpermps_avx2(auVar50,ZEXT1632(auVar29));
    auVar80 = ZEXT3264(local_23f8);
    uVar21 = (ulong)(auVar28._0_4_ < 0.0) << 5;
    uVar19 = (ulong)(auVar27._0_4_ < 0.0) << 5 | 0x40;
    uVar24 = (ulong)(auVar43._0_4_ < 0.0) << 5 | 0x80;
    uVar23 = uVar21 ^ 0x20;
    uVar65 = auVar47._0_4_;
    local_2418._4_4_ = uVar65;
    local_2418._0_4_ = uVar65;
    local_2418._8_4_ = uVar65;
    local_2418._12_4_ = uVar65;
    local_2418._16_4_ = uVar65;
    local_2418._20_4_ = uVar65;
    local_2418._24_4_ = uVar65;
    local_2418._28_4_ = uVar65;
    auVar81 = ZEXT3264(local_2418);
    uVar65 = auVar26._0_4_;
    auVar62 = ZEXT3264(CONCAT428(uVar65,CONCAT424(uVar65,CONCAT420(uVar65,CONCAT416(uVar65,CONCAT412
                                                  (uVar65,CONCAT48(uVar65,CONCAT44(uVar65,uVar65))))
                                                  ))));
    auVar82 = ZEXT3264(_DAT_01fe9900);
    auVar83 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    local_2600 = context;
    local_2608 = ray;
    local_23b8 = fVar57;
    fStack_23b4 = fVar57;
    fStack_23b0 = fVar57;
    fStack_23ac = fVar57;
    fStack_23a8 = fVar57;
    fStack_23a4 = fVar57;
    fStack_23a0 = fVar57;
    fStack_239c = fVar57;
    fVar73 = fVar57;
    fVar74 = fVar57;
    fVar75 = fVar57;
    fVar76 = fVar57;
    fVar77 = fVar57;
    fVar78 = fVar57;
    local_2638 = uVar21;
    do {
      pfVar1 = (float *)(local_25f0 + -1);
      local_25f0 = local_25f0 + -2;
      if (*pfVar1 <= auVar63._0_4_) {
        uVar22 = *local_25f0;
        while ((uVar22 & 8) == 0) {
          pauVar15 = (undefined1 (*) [32])(uVar22 & 0xfffffffffffffff0);
          uVar65 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar64._4_4_ = uVar65;
          auVar64._0_4_ = uVar65;
          auVar64._8_4_ = uVar65;
          auVar64._12_4_ = uVar65;
          auVar64._16_4_ = uVar65;
          auVar64._20_4_ = uVar65;
          auVar64._24_4_ = uVar65;
          auVar64._28_4_ = uVar65;
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar15[8] + uVar21),auVar64,
                                    *(undefined1 (*) [32])(pauVar15[2] + uVar21));
          auVar49 = vsubps_avx512vl(ZEXT1632(auVar47),auVar85._0_32_);
          auVar49 = vmulps_avx512vl(auVar88._0_32_,auVar49);
          auVar49 = vmaxps_avx(auVar81._0_32_,auVar49);
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar15[8] + uVar19),auVar64,
                                    *(undefined1 (*) [32])(pauVar15[2] + uVar19));
          auVar50 = vsubps_avx512vl(ZEXT1632(auVar47),auVar86._0_32_);
          auVar50 = vmulps_avx512vl(auVar89._0_32_,auVar50);
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar15[8] + uVar24),auVar64,
                                    *(undefined1 (*) [32])(pauVar15[2] + uVar24));
          auVar51 = vsubps_avx512vl(ZEXT1632(auVar47),auVar87._0_32_);
          auVar5._4_4_ = auVar71._4_4_ * auVar51._4_4_;
          auVar5._0_4_ = auVar71._0_4_ * auVar51._0_4_;
          auVar5._8_4_ = auVar71._8_4_ * auVar51._8_4_;
          auVar5._12_4_ = auVar71._12_4_ * auVar51._12_4_;
          auVar5._16_4_ = auVar71._16_4_ * auVar51._16_4_;
          auVar5._20_4_ = auVar71._20_4_ * auVar51._20_4_;
          auVar5._24_4_ = auVar71._24_4_ * auVar51._24_4_;
          auVar5._28_4_ = auVar51._28_4_;
          auVar50 = vmaxps_avx(auVar50,auVar5);
          auVar49 = vmaxps_avx(auVar49,auVar50);
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar15[8] + uVar23),auVar64,
                                    *(undefined1 (*) [32])(pauVar15[2] + uVar23));
          auVar50 = vsubps_avx512vl(ZEXT1632(auVar47),auVar85._0_32_);
          auVar51._4_4_ = fVar73 * auVar50._4_4_;
          auVar51._0_4_ = fVar57 * auVar50._0_4_;
          auVar51._8_4_ = fVar74 * auVar50._8_4_;
          auVar51._12_4_ = fVar75 * auVar50._12_4_;
          auVar51._16_4_ = fVar76 * auVar50._16_4_;
          auVar51._20_4_ = fVar77 * auVar50._20_4_;
          auVar51._24_4_ = fVar78 * auVar50._24_4_;
          auVar51._28_4_ = auVar50._28_4_;
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar15[8] + (uVar19 ^ 0x20)),auVar64,
                                    *(undefined1 (*) [32])(pauVar15[2] + (uVar19 ^ 0x20)));
          auVar50 = vsubps_avx512vl(ZEXT1632(auVar47),auVar86._0_32_);
          auVar52._4_4_ = auVar79._4_4_ * auVar50._4_4_;
          auVar52._0_4_ = auVar79._0_4_ * auVar50._0_4_;
          auVar52._8_4_ = auVar79._8_4_ * auVar50._8_4_;
          auVar52._12_4_ = auVar79._12_4_ * auVar50._12_4_;
          auVar52._16_4_ = auVar79._16_4_ * auVar50._16_4_;
          auVar52._20_4_ = auVar79._20_4_ * auVar50._20_4_;
          auVar52._24_4_ = auVar79._24_4_ * auVar50._24_4_;
          auVar52._28_4_ = auVar50._28_4_;
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar15[8] + (uVar24 ^ 0x20)),auVar64,
                                    *(undefined1 (*) [32])(pauVar15[2] + (uVar24 ^ 0x20)));
          auVar50 = vsubps_avx512vl(ZEXT1632(auVar47),auVar87._0_32_);
          auVar55._4_4_ = auVar80._4_4_ * auVar50._4_4_;
          auVar55._0_4_ = auVar80._0_4_ * auVar50._0_4_;
          auVar55._8_4_ = auVar80._8_4_ * auVar50._8_4_;
          auVar55._12_4_ = auVar80._12_4_ * auVar50._12_4_;
          auVar55._16_4_ = auVar80._16_4_ * auVar50._16_4_;
          auVar55._20_4_ = auVar80._20_4_ * auVar50._20_4_;
          auVar55._24_4_ = auVar80._24_4_ * auVar50._24_4_;
          auVar55._28_4_ = auVar50._28_4_;
          auVar50 = vminps_avx(auVar52,auVar55);
          auVar5 = vminps_avx(auVar62._0_32_,auVar51);
          auVar50 = vminps_avx(auVar5,auVar50);
          uVar25 = vcmpps_avx512vl(auVar49,auVar50,2);
          if (((uint)uVar22 & 7) == 6) {
            uVar22 = vcmpps_avx512vl(auVar64,pauVar15[0xe],0xd);
            uVar9 = vcmpps_avx512vl(auVar64,pauVar15[0xf],1);
            uVar25 = uVar25 & uVar22 & uVar9;
          }
          bVar13 = (byte)uVar25;
          if (bVar13 == 0) {
            auVar47 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar63 = ZEXT1664(auVar47);
            goto LAB_01f2111b;
          }
          auVar50 = *pauVar15;
          auVar5 = pauVar15[1];
          auVar51 = vpternlogd_avx512vl(auVar82._0_32_,auVar49,auVar83._0_32_,0xf8);
          auVar52 = vpcompressd_avx512vl(auVar51);
          auVar54._0_4_ =
               (uint)(bVar13 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar51._0_4_;
          bVar4 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar54._4_4_ = (uint)bVar4 * auVar52._4_4_ | (uint)!bVar4 * auVar51._4_4_;
          bVar4 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar54._8_4_ = (uint)bVar4 * auVar52._8_4_ | (uint)!bVar4 * auVar51._8_4_;
          bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar54._12_4_ = (uint)bVar4 * auVar52._12_4_ | (uint)!bVar4 * auVar51._12_4_;
          bVar4 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar54._16_4_ = (uint)bVar4 * auVar52._16_4_ | (uint)!bVar4 * auVar51._16_4_;
          bVar4 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar54._20_4_ = (uint)bVar4 * auVar52._20_4_ | (uint)!bVar4 * auVar51._20_4_;
          bVar4 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar54._24_4_ = (uint)bVar4 * auVar52._24_4_ | (uint)!bVar4 * auVar51._24_4_;
          bVar4 = SUB81(uVar25 >> 7,0);
          auVar54._28_4_ = (uint)bVar4 * auVar52._28_4_ | (uint)!bVar4 * auVar51._28_4_;
          auVar51 = vpermt2q_avx512vl(auVar50,auVar54,auVar5);
          uVar22 = auVar51._0_8_;
          bVar13 = bVar13 - 1 & bVar13;
          if (bVar13 != 0) {
            auVar51 = vpshufd_avx2(auVar54,0x55);
            vpermt2q_avx512vl(auVar50,auVar51,auVar5);
            auVar52 = vpminsd_avx2(auVar54,auVar51);
            auVar51 = vpmaxsd_avx2(auVar54,auVar51);
            bVar13 = bVar13 - 1 & bVar13;
            if (bVar13 == 0) {
              auVar52 = vpermi2q_avx512vl(auVar52,auVar50,auVar5);
              uVar22 = auVar52._0_8_;
              auVar50 = vpermt2q_avx512vl(auVar50,auVar51,auVar5);
              *local_25f0 = auVar50._0_8_;
              auVar49 = vpermd_avx2(auVar51,auVar49);
              *(int *)(local_25f0 + 1) = auVar49._0_4_;
              local_25f0 = local_25f0 + 2;
            }
            else {
              auVar64 = vpshufd_avx2(auVar54,0xaa);
              vpermt2q_avx512vl(auVar50,auVar64,auVar5);
              auVar55 = vpminsd_avx2(auVar52,auVar64);
              auVar52 = vpmaxsd_avx2(auVar52,auVar64);
              auVar64 = vpminsd_avx2(auVar51,auVar52);
              auVar51 = vpmaxsd_avx2(auVar51,auVar52);
              bVar13 = bVar13 - 1 & bVar13;
              if (bVar13 == 0) {
                auVar52 = vpermi2q_avx512vl(auVar55,auVar50,auVar5);
                uVar22 = auVar52._0_8_;
                auVar52 = vpermt2q_avx512vl(auVar50,auVar51,auVar5);
                *local_25f0 = auVar52._0_8_;
                auVar51 = vpermd_avx2(auVar51,auVar49);
                *(int *)(local_25f0 + 1) = auVar51._0_4_;
                auVar50 = vpermt2q_avx512vl(auVar50,auVar64,auVar5);
                local_25f0[2] = auVar50._0_8_;
                auVar49 = vpermd_avx2(auVar64,auVar49);
                *(int *)(local_25f0 + 3) = auVar49._0_4_;
                local_25f0 = local_25f0 + 4;
              }
              else {
                auVar52 = vpshufd_avx2(auVar54,0xff);
                vpermt2q_avx512vl(auVar50,auVar52,auVar5);
                auVar56 = vpminsd_avx2(auVar55,auVar52);
                auVar52 = vpmaxsd_avx2(auVar55,auVar52);
                auVar55 = vpminsd_avx2(auVar64,auVar52);
                auVar52 = vpmaxsd_avx2(auVar64,auVar52);
                auVar64 = vpminsd_avx2(auVar51,auVar52);
                auVar51 = vpmaxsd_avx2(auVar51,auVar52);
                bVar13 = bVar13 - 1 & bVar13;
                if (bVar13 == 0) {
                  auVar52 = vpermi2q_avx512vl(auVar56,auVar50,auVar5);
                  uVar22 = auVar52._0_8_;
                  auVar52 = vpermt2q_avx512vl(auVar50,auVar51,auVar5);
                  *local_25f0 = auVar52._0_8_;
                  auVar51 = vpermd_avx2(auVar51,auVar49);
                  *(int *)(local_25f0 + 1) = auVar51._0_4_;
                  auVar51 = vpermt2q_avx512vl(auVar50,auVar64,auVar5);
                  local_25f0[2] = auVar51._0_8_;
                  auVar51 = vpermd_avx2(auVar64,auVar49);
                  *(int *)(local_25f0 + 3) = auVar51._0_4_;
                  auVar50 = vpermt2q_avx512vl(auVar50,auVar55,auVar5);
                  local_25f0[4] = auVar50._0_8_;
                  auVar49 = vpermd_avx2(auVar55,auVar49);
                  *(int *)(local_25f0 + 5) = auVar49._0_4_;
                  local_25f0 = local_25f0 + 6;
                }
                else {
                  auVar53 = valignd_avx512vl(auVar54,auVar54,3);
                  auVar52 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar54 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar52,auVar56);
                  auVar52 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar55 = vpermt2d_avx512vl(auVar54,auVar52,auVar55);
                  auVar55 = vpermt2d_avx512vl(auVar55,auVar52,auVar64);
                  auVar52 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar51 = vpermt2d_avx512vl(auVar55,auVar52,auVar51);
                  auVar63 = ZEXT3264(auVar51);
                  bVar17 = bVar13;
                  do {
                    auVar52 = auVar63._0_32_;
                    auVar67._8_4_ = 1;
                    auVar67._0_8_ = 0x100000001;
                    auVar67._12_4_ = 1;
                    auVar67._16_4_ = 1;
                    auVar67._20_4_ = 1;
                    auVar67._24_4_ = 1;
                    auVar67._28_4_ = 1;
                    auVar51 = vpermd_avx2(auVar67,auVar53);
                    auVar53 = valignd_avx512vl(auVar53,auVar53,1);
                    vpermt2q_avx512vl(auVar50,auVar53,auVar5);
                    bVar17 = bVar17 - 1 & bVar17;
                    uVar10 = vpcmpd_avx512vl(auVar51,auVar52,5);
                    auVar51 = vpmaxsd_avx2(auVar51,auVar52);
                    bVar11 = (byte)uVar10 << 1;
                    auVar52 = valignd_avx512vl(auVar52,auVar52,7);
                    bVar4 = (bool)((byte)uVar10 & 1);
                    auVar56._4_4_ = (uint)bVar4 * auVar52._4_4_ | (uint)!bVar4 * auVar51._4_4_;
                    auVar56._0_4_ = auVar51._0_4_;
                    bVar4 = (bool)(bVar11 >> 2 & 1);
                    auVar56._8_4_ = (uint)bVar4 * auVar52._8_4_ | (uint)!bVar4 * auVar51._8_4_;
                    bVar4 = (bool)(bVar11 >> 3 & 1);
                    auVar56._12_4_ = (uint)bVar4 * auVar52._12_4_ | (uint)!bVar4 * auVar51._12_4_;
                    bVar4 = (bool)(bVar11 >> 4 & 1);
                    auVar56._16_4_ = (uint)bVar4 * auVar52._16_4_ | (uint)!bVar4 * auVar51._16_4_;
                    bVar4 = (bool)(bVar11 >> 5 & 1);
                    auVar56._20_4_ = (uint)bVar4 * auVar52._20_4_ | (uint)!bVar4 * auVar51._20_4_;
                    bVar4 = (bool)(bVar11 >> 6 & 1);
                    auVar56._24_4_ = (uint)bVar4 * auVar52._24_4_ | (uint)!bVar4 * auVar51._24_4_;
                    auVar56._28_4_ =
                         (uint)(bVar11 >> 7) * auVar52._28_4_ |
                         (uint)!(bool)(bVar11 >> 7) * auVar51._28_4_;
                    auVar63 = ZEXT3264(auVar56);
                  } while (bVar17 != 0);
                  lVar16 = (ulong)(uint)POPCOUNT((uint)bVar13) + 3;
                  do {
                    auVar51 = vpermi2q_avx512vl(auVar56,auVar50,auVar5);
                    *local_25f0 = auVar51._0_8_;
                    auVar52 = auVar63._0_32_;
                    auVar51 = vpermd_avx2(auVar52,auVar49);
                    *(int *)(local_25f0 + 1) = auVar51._0_4_;
                    auVar56 = valignd_avx512vl(auVar52,auVar52,1);
                    local_25f0 = local_25f0 + 2;
                    auVar63 = ZEXT3264(auVar56);
                    lVar16 = lVar16 + -1;
                  } while (lVar16 != 0);
                  auVar49 = vpermt2q_avx512vl(auVar50,auVar56,auVar5);
                  uVar22 = auVar49._0_8_;
                }
                auVar85 = ZEXT3264(local_24d8);
                auVar86 = ZEXT3264(local_24f8);
                auVar87 = ZEXT3264(local_2518);
                auVar88 = ZEXT3264(local_2538);
                auVar89 = ZEXT3264(local_2558);
                auVar71 = ZEXT3264(auVar71._0_32_);
                auVar79 = ZEXT3264(auVar79._0_32_);
                auVar80 = ZEXT3264(auVar80._0_32_);
                auVar81 = ZEXT3264(auVar81._0_32_);
                auVar82 = ZEXT3264(auVar82._0_32_);
                auVar83 = ZEXT3264(auVar83._0_32_);
                uVar21 = local_2638;
              }
            }
          }
        }
        local_25e8 = (ulong)((uint)uVar22 & 0xf) - 8;
        if (local_25e8 != 0) {
          uVar22 = uVar22 & 0xfffffffffffffff0;
          local_25e0 = 0;
          do {
            local_2618 = local_25e0 * 0x140;
            uVar65 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar37._4_4_ = uVar65;
            auVar37._0_4_ = uVar65;
            auVar37._8_4_ = uVar65;
            auVar37._12_4_ = uVar65;
            auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x90 + local_2618),auVar37,
                                      *(undefined1 (*) [16])(uVar22 + local_2618));
            auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xa0 + local_2618),auVar37,
                                      *(undefined1 (*) [16])(uVar22 + 0x10 + local_2618));
            auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xb0 + local_2618),auVar37,
                                      *(undefined1 (*) [16])(uVar22 + 0x20 + local_2618));
            auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xc0 + local_2618),auVar37,
                                      *(undefined1 (*) [16])(uVar22 + 0x30 + local_2618));
            auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xd0 + local_2618),auVar37,
                                      *(undefined1 (*) [16])(uVar22 + 0x40 + local_2618));
            auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xe0 + local_2618),auVar37,
                                      *(undefined1 (*) [16])(uVar22 + 0x50 + local_2618));
            auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xf0 + local_2618),auVar37,
                                      *(undefined1 (*) [16])(uVar22 + 0x60 + local_2618));
            auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x100 + local_2618),auVar37,
                                      *(undefined1 (*) [16])(uVar22 + 0x70 + local_2618));
            auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x110 + local_2618),auVar37,
                                      *(undefined1 (*) [16])(uVar22 + 0x80 + local_2618));
            uVar65 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar38._4_4_ = uVar65;
            auVar38._0_4_ = uVar65;
            auVar38._8_4_ = uVar65;
            auVar38._12_4_ = uVar65;
            auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]))
            ;
            auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar65 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar69._4_4_ = uVar65;
            auVar69._0_4_ = uVar65;
            auVar69._8_4_ = uVar65;
            auVar69._12_4_ = uVar65;
            uVar65 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar70._4_4_ = uVar65;
            auVar70._0_4_ = uVar65;
            auVar70._8_4_ = uVar65;
            auVar70._12_4_ = uVar65;
            fVar57 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar72._4_4_ = fVar57;
            auVar72._0_4_ = fVar57;
            auVar72._8_4_ = fVar57;
            auVar72._12_4_ = fVar57;
            auVar47 = vsubps_avx(auVar47,auVar38);
            auVar32 = vsubps_avx512vl(auVar26,auVar30);
            auVar33 = vsubps_avx512vl(auVar27,auVar31);
            auVar34 = vsubps_avx512vl(auVar43,auVar38);
            auVar29 = vsubps_avx512vl(auVar29,auVar30);
            auVar35 = vsubps_avx512vl(auVar35,auVar31);
            auVar28 = vsubps_avx512vl(auVar28,auVar38);
            auVar36 = vsubps_avx512vl(auVar36,auVar30);
            auVar37 = vsubps_avx512vl(auVar37,auVar31);
            auVar30 = vsubps_avx512vl(auVar28,auVar47);
            auVar31 = vsubps_avx512vl(auVar36,auVar32);
            auVar26 = vsubps_avx(auVar37,auVar33);
            auVar38 = vsubps_avx512vl(auVar47,auVar34);
            auVar39 = vsubps_avx512vl(auVar32,auVar29);
            auVar40 = vsubps_avx512vl(auVar33,auVar35);
            auVar41 = vsubps_avx512vl(auVar34,auVar28);
            auVar42 = vsubps_avx512vl(auVar29,auVar36);
            auVar27 = vsubps_avx(auVar35,auVar37);
            auVar43 = vaddps_avx512vl(auVar28,auVar47);
            auVar44 = vaddps_avx512vl(auVar36,auVar32);
            auVar45 = vaddps_avx512vl(auVar37,auVar33);
            auVar46 = vmulps_avx512vl(auVar44,auVar26);
            auVar46 = vfmsub231ps_avx512vl(auVar46,auVar31,auVar45);
            auVar45 = vmulps_avx512vl(auVar45,auVar30);
            auVar45 = vfmsub231ps_avx512vl(auVar45,auVar26,auVar43);
            auVar66._0_4_ = auVar31._0_4_ * auVar43._0_4_;
            auVar66._4_4_ = auVar31._4_4_ * auVar43._4_4_;
            auVar66._8_4_ = auVar31._8_4_ * auVar43._8_4_;
            auVar66._12_4_ = auVar31._12_4_ * auVar43._12_4_;
            auVar43 = vfmsub231ps_fma(auVar66,auVar30,auVar44);
            auVar44._0_4_ = fVar57 * auVar43._0_4_;
            auVar44._4_4_ = fVar57 * auVar43._4_4_;
            auVar44._8_4_ = fVar57 * auVar43._8_4_;
            auVar44._12_4_ = fVar57 * auVar43._12_4_;
            auVar43 = vfmadd231ps_avx512vl(auVar44,auVar70,auVar45);
            local_24b8 = vfmadd231ps_avx512vl(auVar43,auVar69,auVar46);
            auVar43 = vaddps_avx512vl(auVar47,auVar34);
            auVar44 = vaddps_avx512vl(auVar32,auVar29);
            auVar45 = vaddps_avx512vl(auVar33,auVar35);
            auVar46 = vmulps_avx512vl(auVar44,auVar40);
            auVar46 = vfmsub231ps_avx512vl(auVar46,auVar39,auVar45);
            auVar45 = vmulps_avx512vl(auVar45,auVar38);
            auVar45 = vfmsub231ps_avx512vl(auVar45,auVar40,auVar43);
            auVar43 = vmulps_avx512vl(auVar43,auVar39);
            auVar43 = vfmsub231ps_avx512vl(auVar43,auVar38,auVar44);
            auVar68._0_4_ = fVar57 * auVar43._0_4_;
            auVar68._4_4_ = fVar57 * auVar43._4_4_;
            auVar68._8_4_ = fVar57 * auVar43._8_4_;
            auVar68._12_4_ = fVar57 * auVar43._12_4_;
            auVar43 = vfmadd231ps_avx512vl(auVar68,auVar70,auVar45);
            local_24a8 = vfmadd231ps_avx512vl(auVar43,auVar69,auVar46);
            auVar28 = vaddps_avx512vl(auVar34,auVar28);
            auVar29 = vaddps_avx512vl(auVar29,auVar36);
            auVar34._0_4_ = auVar35._0_4_ + auVar37._0_4_;
            auVar34._4_4_ = auVar35._4_4_ + auVar37._4_4_;
            auVar34._8_4_ = auVar35._8_4_ + auVar37._8_4_;
            auVar34._12_4_ = auVar35._12_4_ + auVar37._12_4_;
            auVar43 = vmulps_avx512vl(auVar29,auVar27);
            auVar43 = vfmsub231ps_fma(auVar43,auVar42,auVar34);
            auVar45._0_4_ = auVar34._0_4_ * auVar41._0_4_;
            auVar45._4_4_ = auVar34._4_4_ * auVar41._4_4_;
            auVar45._8_4_ = auVar34._8_4_ * auVar41._8_4_;
            auVar45._12_4_ = auVar34._12_4_ * auVar41._12_4_;
            auVar35 = vfmsub231ps_avx512vl(auVar45,auVar27,auVar28);
            auVar28 = vmulps_avx512vl(auVar28,auVar42);
            auVar29 = vfmsub231ps_avx512vl(auVar28,auVar41,auVar29);
            auVar29 = vmulps_avx512vl(auVar72,auVar29);
            auVar29 = vfmadd231ps_avx512vl(auVar29,auVar70,auVar35);
            auVar43 = vfmadd231ps_avx512vl(auVar29,auVar69,auVar43);
            auVar46._0_4_ = local_24b8._0_4_ + local_24a8._0_4_;
            auVar46._4_4_ = local_24b8._4_4_ + local_24a8._4_4_;
            auVar46._8_4_ = local_24b8._8_4_ + local_24a8._8_4_;
            auVar46._12_4_ = local_24b8._12_4_ + local_24a8._12_4_;
            local_2498 = vaddps_avx512vl(auVar43,auVar46);
            auVar28._8_4_ = 0x7fffffff;
            auVar28._0_8_ = 0x7fffffff7fffffff;
            auVar28._12_4_ = 0x7fffffff;
            auVar29 = vandps_avx512vl(local_2498,auVar28);
            auVar36._8_4_ = 0x34000000;
            auVar36._0_8_ = 0x3400000034000000;
            auVar36._12_4_ = 0x34000000;
            auVar35 = vmulps_avx512vl(auVar29,auVar36);
            auVar28 = vminps_avx512vl(local_24b8,local_24a8);
            auVar28 = vminps_avx512vl(auVar28,auVar43);
            auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar36 = vxorps_avx512vl(auVar35,auVar36);
            uVar10 = vcmpps_avx512vl(auVar28,auVar36,5);
            auVar28 = vmaxps_avx512vl(local_24b8,local_24a8);
            auVar43 = vmaxps_avx512vl(auVar28,auVar43);
            uVar6 = vcmpps_avx512vl(auVar43,auVar35,2);
            local_2480 = ((byte)uVar10 | (byte)uVar6) & 0xf;
            if (local_2480 != 0) {
              auVar43 = vmulps_avx512vl(auVar26,auVar39);
              auVar35 = vmulps_avx512vl(auVar30,auVar40);
              auVar28 = vmulps_avx512vl(auVar31,auVar38);
              auVar36 = vmulps_avx512vl(auVar40,auVar42);
              auVar37 = vmulps_avx512vl(auVar38,auVar27);
              auVar34 = vmulps_avx512vl(auVar39,auVar41);
              auVar31 = vfmsub213ps_avx512vl(auVar31,auVar40,auVar43);
              auVar26 = vfmsub213ps_avx512vl(auVar26,auVar38,auVar35);
              auVar30 = vfmsub213ps_avx512vl(auVar30,auVar39,auVar28);
              auVar27 = vfmsub213ps_avx512vl(auVar27,auVar39,auVar36);
              auVar39 = vfmsub213ps_avx512vl(auVar41,auVar40,auVar37);
              auVar38 = vfmsub213ps_avx512vl(auVar42,auVar38,auVar34);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar43 = vandps_avx512vl(auVar43,auVar40);
              auVar36 = vandps_avx512vl(auVar36,auVar40);
              uVar25 = vcmpps_avx512vl(auVar43,auVar36,1);
              auVar43 = vandps_avx512vl(auVar35,auVar40);
              auVar35 = vandps_avx512vl(auVar37,auVar40);
              uVar9 = vcmpps_avx512vl(auVar43,auVar35,1);
              auVar43 = vandps_avx512vl(auVar28,auVar40);
              auVar35 = vandps_avx512vl(auVar34,auVar40);
              uVar7 = vcmpps_avx512vl(auVar43,auVar35,1);
              bVar4 = (bool)((byte)uVar25 & 1);
              local_2448._0_4_ = (uint)bVar4 * auVar31._0_4_ | (uint)!bVar4 * auVar27._0_4_;
              bVar4 = (bool)((byte)(uVar25 >> 1) & 1);
              local_2448._4_4_ = (uint)bVar4 * auVar31._4_4_ | (uint)!bVar4 * auVar27._4_4_;
              bVar4 = (bool)((byte)(uVar25 >> 2) & 1);
              local_2448._8_4_ = (uint)bVar4 * auVar31._8_4_ | (uint)!bVar4 * auVar27._8_4_;
              bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
              local_2448._12_4_ = (uint)bVar4 * auVar31._12_4_ | (uint)!bVar4 * auVar27._12_4_;
              bVar4 = (bool)((byte)uVar9 & 1);
              local_2438._0_4_ = (uint)bVar4 * auVar26._0_4_ | (uint)!bVar4 * auVar39._0_4_;
              bVar4 = (bool)((byte)(uVar9 >> 1) & 1);
              local_2438._4_4_ = (uint)bVar4 * auVar26._4_4_ | (uint)!bVar4 * auVar39._4_4_;
              bVar4 = (bool)((byte)(uVar9 >> 2) & 1);
              local_2438._8_4_ = (uint)bVar4 * auVar26._8_4_ | (uint)!bVar4 * auVar39._8_4_;
              bVar4 = (bool)((byte)(uVar9 >> 3) & 1);
              local_2438._12_4_ = (uint)bVar4 * auVar26._12_4_ | (uint)!bVar4 * auVar39._12_4_;
              bVar4 = (bool)((byte)uVar7 & 1);
              local_2428[0] = (float)((uint)bVar4 * auVar30._0_4_ | (uint)!bVar4 * auVar38._0_4_);
              bVar4 = (bool)((byte)(uVar7 >> 1) & 1);
              local_2428[1] = (float)((uint)bVar4 * auVar30._4_4_ | (uint)!bVar4 * auVar38._4_4_);
              bVar4 = (bool)((byte)(uVar7 >> 2) & 1);
              local_2428[2] = (float)((uint)bVar4 * auVar30._8_4_ | (uint)!bVar4 * auVar38._8_4_);
              bVar4 = (bool)((byte)(uVar7 >> 3) & 1);
              local_2428[3] = (float)((uint)bVar4 * auVar30._12_4_ | (uint)!bVar4 * auVar38._12_4_);
              auVar41._0_4_ = fVar57 * local_2428[0];
              auVar41._4_4_ = fVar57 * local_2428[1];
              auVar41._8_4_ = fVar57 * local_2428[2];
              auVar41._12_4_ = fVar57 * local_2428[3];
              auVar26 = vfmadd213ps_fma(auVar70,local_2438,auVar41);
              auVar26 = vfmadd213ps_fma(auVar69,local_2448,auVar26);
              auVar39._0_4_ = auVar26._0_4_ + auVar26._0_4_;
              auVar39._4_4_ = auVar26._4_4_ + auVar26._4_4_;
              auVar39._8_4_ = auVar26._8_4_ + auVar26._8_4_;
              auVar39._12_4_ = auVar26._12_4_ + auVar26._12_4_;
              auVar40._0_4_ = auVar33._0_4_ * local_2428[0];
              auVar40._4_4_ = auVar33._4_4_ * local_2428[1];
              auVar40._8_4_ = auVar33._8_4_ * local_2428[2];
              auVar40._12_4_ = auVar33._12_4_ * local_2428[3];
              auVar26 = vfmadd213ps_fma(auVar32,local_2438,auVar40);
              auVar26 = vfmadd213ps_fma(auVar47,local_2448,auVar26);
              auVar47 = vrcp14ps_avx512vl(auVar39);
              auVar43 = auVar84._0_16_;
              auVar27 = vfnmadd213ps_avx512vl(auVar47,auVar39,auVar43);
              auVar47 = vfmadd132ps_fma(auVar27,auVar47,auVar47);
              local_2458._0_4_ = auVar47._0_4_ * (auVar26._0_4_ + auVar26._0_4_);
              local_2458._4_4_ = auVar47._4_4_ * (auVar26._4_4_ + auVar26._4_4_);
              local_2458._8_4_ = auVar47._8_4_ * (auVar26._8_4_ + auVar26._8_4_);
              local_2458._12_4_ = auVar47._12_4_ * (auVar26._12_4_ + auVar26._12_4_);
              auVar62 = ZEXT1664(local_2458);
              uVar65 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar47._4_4_ = uVar65;
              auVar47._0_4_ = uVar65;
              auVar47._8_4_ = uVar65;
              auVar47._12_4_ = uVar65;
              uVar10 = vcmpps_avx512vl(local_2458,auVar47,0xd);
              uVar25 = CONCAT44(auVar39._4_4_,auVar39._0_4_);
              auVar31._0_8_ = uVar25 ^ 0x8000000080000000;
              auVar31._8_4_ = -auVar39._8_4_;
              auVar31._12_4_ = -auVar39._12_4_;
              fVar57 = (ray->super_RayK<1>).tfar;
              auVar30._4_4_ = fVar57;
              auVar30._0_4_ = fVar57;
              auVar30._8_4_ = fVar57;
              auVar30._12_4_ = fVar57;
              uVar6 = vcmpps_avx512vl(local_2458,auVar30,2);
              uVar8 = vcmpps_avx512vl(auVar39,auVar31,4);
              local_2480 = (byte)uVar10 & (byte)uVar6 & (byte)uVar8 & local_2480;
              if (local_2480 != 0) {
                auVar32._0_4_ = (ray->super_RayK<1>).tfar;
                auVar32._4_4_ = (ray->super_RayK<1>).mask;
                auVar32._8_4_ = (ray->super_RayK<1>).id;
                auVar32._12_4_ = (ray->super_RayK<1>).flags;
                auVar63 = ZEXT1664(auVar32);
                uVar14 = vextractps_avx(auVar32,1);
                local_2618 = local_2618 + uVar22;
                local_2488 = &local_2639;
                auVar33._8_4_ = 0x219392ef;
                auVar33._0_8_ = 0x219392ef219392ef;
                auVar33._12_4_ = 0x219392ef;
                uVar25 = vcmpps_avx512vl(auVar29,auVar33,5);
                auVar47 = vrcp14ps_avx512vl(local_2498);
                auVar26 = vfnmadd213ps_avx512vl(local_2498,auVar47,auVar43);
                auVar47 = vfmadd132ps_avx512vl(auVar26,auVar47,auVar47);
                fVar75 = (float)((uint)((byte)uVar25 & 1) * auVar47._0_4_);
                fVar74 = (float)((uint)((byte)(uVar25 >> 1) & 1) * auVar47._4_4_);
                fVar73 = (float)((uint)((byte)(uVar25 >> 2) & 1) * auVar47._8_4_);
                fVar57 = (float)((uint)((byte)(uVar25 >> 3) & 1) * auVar47._12_4_);
                auVar58._0_4_ = fVar75 * local_24b8._0_4_;
                auVar58._4_4_ = fVar74 * local_24b8._4_4_;
                auVar58._8_4_ = fVar73 * local_24b8._8_4_;
                auVar58._12_4_ = fVar57 * local_24b8._12_4_;
                local_2478 = vminps_avx512vl(auVar58,auVar43);
                auVar59._0_4_ = fVar75 * local_24a8._0_4_;
                auVar59._4_4_ = fVar74 * local_24a8._4_4_;
                auVar59._8_4_ = fVar73 * local_24a8._8_4_;
                auVar59._12_4_ = fVar57 * local_24a8._12_4_;
                local_2468 = vminps_avx512vl(auVar59,auVar43);
                local_25f8 = context->scene;
                auVar60._8_4_ = 0x7f800000;
                auVar60._0_8_ = 0x7f8000007f800000;
                auVar60._12_4_ = 0x7f800000;
                auVar47 = vblendmps_avx512vl(auVar60,local_2458);
                auVar42._0_4_ =
                     (uint)(local_2480 & 1) * auVar47._0_4_ |
                     (uint)!(bool)(local_2480 & 1) * 0x7f800000;
                bVar4 = (bool)(local_2480 >> 1 & 1);
                auVar42._4_4_ = (uint)bVar4 * auVar47._4_4_ | (uint)!bVar4 * 0x7f800000;
                bVar4 = (bool)(local_2480 >> 2 & 1);
                auVar42._8_4_ = (uint)bVar4 * auVar47._8_4_ | (uint)!bVar4 * 0x7f800000;
                auVar42._12_4_ =
                     (uint)(local_2480 >> 3) * auVar47._12_4_ |
                     (uint)!(bool)(local_2480 >> 3) * 0x7f800000;
                auVar47 = vshufps_avx(auVar42,auVar42,0xb1);
                auVar47 = vminps_avx(auVar47,auVar42);
                auVar26 = vshufpd_avx(auVar47,auVar47,1);
                auVar47 = vminps_avx(auVar26,auVar47);
                uVar10 = vcmpps_avx512vl(auVar42,auVar47,0);
                local_2640 = (uint)local_2480;
                bVar13 = local_2480;
                if (((byte)uVar10 & local_2480) != 0) {
                  bVar13 = (byte)uVar10 & local_2480;
                }
                uVar18 = 0;
                for (uVar20 = (uint)bVar13; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
                  uVar18 = uVar18 + 1;
                }
                do {
                  uVar20 = uVar18 & 0xff;
                  local_2620 = (ulong)uVar20;
                  local_2590 = *(uint *)(local_2618 + 0x120 + local_2620 * 4);
                  local_2630 = (local_25f8->geometries).items[local_2590].ptr;
                  if ((local_2630->mask & uVar14) == 0) {
                    bVar13 = ~(byte)(1 << (uVar18 & 0x1f)) & (byte)local_2640;
                  }
                  else {
                    local_2628 = context->args;
                    local_2578 = auVar63._0_16_;
                    if (local_2628->filter == (RTCFilterFunctionN)0x0) {
                      local_25d8.context = context->user;
                      if (local_2630->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar25 = (ulong)(uVar20 << 2);
                        fVar57 = *(float *)(local_2478 + uVar25);
                        fVar73 = *(float *)(local_2468 + uVar25);
                        (ray->super_RayK<1>).tfar = *(float *)(local_2458 + uVar25);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_2448 + uVar25);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_2438 + uVar25);
                        (ray->Ng).field_0.field_0.z = *(float *)((long)local_2428 + uVar25);
                        ray->u = fVar57;
                        ray->v = fVar73;
                        ray->primID = *(uint *)(local_2618 + 0x130 + uVar25);
                        ray->geomID = local_2590;
                        ray->instID[0] = (local_25d8.context)->instID[0];
                        ray->instPrimID[0] = (local_25d8.context)->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      local_25d8.context = context->user;
                    }
                    uVar25 = (ulong)(uVar20 * 4);
                    local_25a8 = *(float *)(local_2448 + uVar25);
                    local_25a4 = *(undefined4 *)(local_2438 + uVar25);
                    local_25a0 = *(undefined4 *)((long)local_2428 + uVar25);
                    local_259c = *(undefined4 *)(local_2478 + uVar25);
                    local_2598 = *(undefined4 *)(local_2468 + uVar25);
                    local_2594 = *(undefined4 *)(local_2618 + 0x130 + uVar25);
                    local_258c = (local_25d8.context)->instID[0];
                    local_2588 = (local_25d8.context)->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2458 + uVar25);
                    local_260c = -1;
                    local_25d8.valid = &local_260c;
                    local_25d8.geometryUserPtr = local_2630->userPtr;
                    local_25d8.ray = (RTCRayN *)ray;
                    local_25d8.hit = (RTCHitN *)&local_25a8;
                    local_25d8.N = 1;
                    local_2568 = auVar62._0_16_;
                    if (local_2630->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01f20ee6:
                      if ((local_2628->filter != (RTCFilterFunctionN)0x0) &&
                         (((local_2628->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_2630->field_8).field_0x2 & 0x40) != 0)))) {
                        (*local_2628->filter)(&local_25d8);
                        auVar62 = ZEXT1664(local_2568);
                        auVar89 = ZEXT3264(local_2558);
                        auVar88 = ZEXT3264(local_2538);
                        auVar87 = ZEXT3264(local_2518);
                        auVar86 = ZEXT3264(local_24f8);
                        auVar85 = ZEXT3264(local_24d8);
                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar84 = ZEXT1664(auVar47);
                        context = local_2600;
                        ray = local_2608;
                        uVar21 = local_2638;
                        if (*local_25d8.valid == 0) goto LAB_01f20fda;
                      }
                      (((Vec3f *)((long)local_25d8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_25d8.hit;
                      (((Vec3f *)((long)local_25d8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_25d8.hit + 4);
                      (((Vec3f *)((long)local_25d8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_25d8.hit + 8);
                      *(float *)((long)local_25d8.ray + 0x3c) = *(float *)(local_25d8.hit + 0xc);
                      *(float *)((long)local_25d8.ray + 0x40) = *(float *)(local_25d8.hit + 0x10);
                      *(float *)((long)local_25d8.ray + 0x44) = *(float *)(local_25d8.hit + 0x14);
                      *(float *)((long)local_25d8.ray + 0x48) = *(float *)(local_25d8.hit + 0x18);
                      *(float *)((long)local_25d8.ray + 0x4c) = *(float *)(local_25d8.hit + 0x1c);
                      *(float *)((long)local_25d8.ray + 0x50) = *(float *)(local_25d8.hit + 0x20);
                    }
                    else {
                      (*local_2630->intersectionFilterN)(&local_25d8);
                      auVar62 = ZEXT1664(local_2568);
                      auVar89 = ZEXT3264(local_2558);
                      auVar88 = ZEXT3264(local_2538);
                      auVar87 = ZEXT3264(local_2518);
                      auVar86 = ZEXT3264(local_24f8);
                      auVar85 = ZEXT3264(local_24d8);
                      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar84 = ZEXT1664(auVar47);
                      context = local_2600;
                      ray = local_2608;
                      uVar21 = local_2638;
                      if (*local_25d8.valid != 0) goto LAB_01f20ee6;
LAB_01f20fda:
                      (local_2608->super_RayK<1>).tfar = (float)local_2578._0_4_;
                      context = local_2600;
                      ray = local_2608;
                      uVar21 = local_2638;
                    }
                    auVar3._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar3._4_4_ = (ray->super_RayK<1>).mask;
                    auVar3._8_4_ = (ray->super_RayK<1>).id;
                    auVar3._12_4_ = (ray->super_RayK<1>).flags;
                    auVar63 = ZEXT1664(auVar3);
                    fVar57 = (ray->super_RayK<1>).tfar;
                    auVar12._4_4_ = fVar57;
                    auVar12._0_4_ = fVar57;
                    auVar12._8_4_ = fVar57;
                    auVar12._12_4_ = fVar57;
                    uVar10 = vcmpps_avx512vl(auVar62._0_16_,auVar12,2);
                    bVar13 = ~(byte)(1 << ((uint)local_2620 & 0x1f)) & (byte)local_2640 &
                             (byte)uVar10;
                    uVar14 = vextractps_avx(auVar3,1);
                  }
                  local_2640 = (uint)bVar13;
                  if (bVar13 == 0) break;
                  auVar61._8_4_ = 0x7f800000;
                  auVar61._0_8_ = 0x7f8000007f800000;
                  auVar61._12_4_ = 0x7f800000;
                  auVar47 = vblendmps_avx512vl(auVar61,auVar62._0_16_);
                  auVar48._0_4_ =
                       (uint)(bVar13 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar13 & 1) * 0x7f800000;
                  bVar4 = (bool)(bVar13 >> 1 & 1);
                  auVar48._4_4_ = (uint)bVar4 * auVar47._4_4_ | (uint)!bVar4 * 0x7f800000;
                  bVar4 = (bool)(bVar13 >> 2 & 1);
                  auVar48._8_4_ = (uint)bVar4 * auVar47._8_4_ | (uint)!bVar4 * 0x7f800000;
                  auVar48._12_4_ =
                       (uint)(bVar13 >> 3) * auVar47._12_4_ |
                       (uint)!(bool)(bVar13 >> 3) * 0x7f800000;
                  auVar47 = vshufps_avx(auVar48,auVar48,0xb1);
                  auVar47 = vminps_avx(auVar47,auVar48);
                  auVar26 = vshufpd_avx(auVar47,auVar47,1);
                  auVar47 = vminps_avx(auVar26,auVar47);
                  uVar10 = vcmpps_avx512vl(auVar48,auVar47,0);
                  bVar13 = (byte)uVar10 & bVar13;
                  uVar20 = local_2640;
                  if (bVar13 != 0) {
                    uVar20 = (uint)bVar13;
                  }
                  uVar18 = 0;
                  for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
                    uVar18 = uVar18 + 1;
                  }
                } while( true );
              }
            }
            local_25e0 = local_25e0 + 1;
          } while (local_25e0 != local_25e8);
        }
        fVar57 = (ray->super_RayK<1>).tfar;
        auVar62 = ZEXT3264(CONCAT428(fVar57,CONCAT424(fVar57,CONCAT420(fVar57,CONCAT416(fVar57,
                                                  CONCAT412(fVar57,CONCAT48(fVar57,CONCAT44(fVar57,
                                                  fVar57))))))));
        auVar63 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar71 = ZEXT3264(local_2398);
        auVar79 = ZEXT3264(local_23d8);
        auVar80 = ZEXT3264(local_23f8);
        auVar81 = ZEXT3264(local_2418);
        auVar82 = ZEXT3264(_DAT_01fe9900);
        auVar83 = ZEXT3264(CONCAT428(0xfffffff8,
                                     CONCAT424(0xfffffff8,
                                               CONCAT420(0xfffffff8,
                                                         CONCAT416(0xfffffff8,
                                                                   CONCAT412(0xfffffff8,
                                                                             CONCAT48(0xfffffff8,
                                                                                                                                                                            
                                                  0xfffffff8fffffff8)))))));
        fVar57 = local_23b8;
        fVar73 = fStack_23b4;
        fVar74 = fStack_23b0;
        fVar75 = fStack_23ac;
        fVar76 = fStack_23a8;
        fVar77 = fStack_23a4;
        fVar78 = fStack_23a0;
      }
LAB_01f2111b:
    } while (local_25f0 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }